

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-close-stdout-read-stdin.c
# Opt level: O0

int run_test_pipe_close_stdout_read_stdin(void)

{
  int iVar1;
  ssize_t sVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t stdin_pipe;
  int iStack_20;
  char buf;
  int status;
  int fd [2];
  int pid;
  int r;
  
  fd[1] = -1;
  fd[1] = pipe(&stack0xffffffffffffffe0);
  if ((long)fd[1] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
            ,0x40,"r","==","0",(long)fd[1],"==",0);
    abort();
  }
  fd[0] = fork();
  if (fd[0] == 0) {
    close(status);
    sVar2 = read(iStack_20,(void *)((long)&stdin_pipe.pipe_fname + 3),1);
    fd[1] = (int)sVar2;
    if ((fd[1] < -1) || (1 < fd[1])) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x50,"-1 <= r && r <= 1");
      abort();
    }
    close(0);
    fd[1] = dup(iStack_20);
    if (fd[1] == -1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x53,"r","!=","-1",0xffffffffffffffff,"!=",0xffffffffffffffff);
      abort();
    }
    uVar3 = uv_default_loop();
    fd[1] = uv_pipe_init(uVar3,&eval_a,0);
    if ((long)fd[1] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x57,"r","==","0",(long)fd[1],"==",0);
      abort();
    }
    fd[1] = uv_pipe_open(&eval_a,0);
    if ((long)fd[1] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x5a,"r","==","0",(long)fd[1],"==",0);
      abort();
    }
    fd[1] = uv_read_start(&eval_a,alloc_buffer,read_stdin);
    if ((long)fd[1] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x5d,"r","==","0",(long)fd[1],"==",0);
      abort();
    }
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,2);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,100,"uv_run(uv_default_loop(), UV_RUN_NOWAIT)","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  else {
    close(status);
    close(iStack_20);
    waitpid(fd[0],(int *)((long)&stdin_pipe.pipe_fname + 4),0);
    if (((stdin_pipe.pipe_fname._4_4_ & 0x7f) != 0) ||
       ((int)(stdin_pipe.pipe_fname._4_4_ & 0xff00) >> 8 != 0)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x6f,"WIFEXITED(status) && WEXITSTATUS(status) == 0");
      abort();
    }
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if ((long)iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-close-stdout-read-stdin.c"
          ,0x72,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
  abort();
}

Assistant:

TEST_IMPL(pipe_close_stdout_read_stdin) {
  int r = -1;
  int pid;
  int fd[2];
  int status;
  char buf;
  uv_pipe_t stdin_pipe;

  r = pipe(fd);
  ASSERT_OK(r);
    
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  pid = -1;
#else
  pid = fork();
#endif

  if (pid == 0) {
    /*
     * Make the read side of the pipe our stdin.
     * The write side will be closed by the parent process.
    */
    close(fd[1]);
    /* block until write end of pipe is closed */
    r = read(fd[0], &buf, 1);
    ASSERT(-1 <= r && r <= 1);
    close(0);
    r = dup(fd[0]);
    ASSERT_NE(r, -1);

    /* Create a stream that reads from the pipe. */
    r = uv_pipe_init(uv_default_loop(), (uv_pipe_t *)&stdin_pipe, 0);
    ASSERT_OK(r);

    r = uv_pipe_open((uv_pipe_t *)&stdin_pipe, 0);
    ASSERT_OK(r);

    r = uv_read_start((uv_stream_t *)&stdin_pipe, alloc_buffer, read_stdin);
    ASSERT_OK(r);

    /*
     * Because the other end of the pipe was closed, there should
     * be no event left to process after one run of the event loop.
     * Otherwise, it means that events were not processed correctly.
     */
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_NOWAIT));
  } else {
    /*
     * Close both ends of the pipe so that the child
     * get a POLLHUP event when it tries to read from
     * the other end.
     */
     close(fd[1]);
     close(fd[0]);

    waitpid(pid, &status, 0);
    ASSERT(WIFEXITED(status) && WEXITSTATUS(status) == 0);
  }

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}